

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O1

bool __thiscall cmSourceFile::TryFullPath(cmSourceFile *this,string *path,string *ext)

{
  pointer pcVar1;
  bool bVar2;
  string tryPath;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (path->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + path->_M_string_length);
  if (ext->_M_string_length != 0) {
    std::__cxx11::string::append((char *)local_40);
    std::__cxx11::string::_M_append((char *)local_40,(ulong)(ext->_M_dataplus)._M_p);
  }
  bVar2 = cmsys::SystemTools::FileExists((char *)local_40[0]);
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)&this->FullPath);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return bVar2;
}

Assistant:

bool cmSourceFile::TryFullPath(const std::string& path, const std::string& ext)
{
  std::string tryPath = path;
  if (!ext.empty()) {
    tryPath += ".";
    tryPath += ext;
  }
  if (cmSystemTools::FileExists(tryPath.c_str())) {
    this->FullPath = tryPath;
    return true;
  }
  return false;
}